

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::
to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *this,
          __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
          ibegin,__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                 iend,resizable_tensor *data)

{
  longlong lVar1;
  difference_type dVar2;
  ostream *poVar3;
  undefined8 uVar4;
  ostream *poVar5;
  string *a;
  tensor *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  resizable_tensor *in_stack_00000048;
  input_rgb_image *in_stack_00000050;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_00000058;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_00000060;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_fffffffffffffb78;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  error_type eVar6;
  fatal_error *in_stack_fffffffffffffb90;
  ostringstream local_378 [376];
  undefined8 local_200;
  undefined8 local_1f8;
  undefined1 local_1e9;
  ostringstream local_1b8 [376];
  undefined8 local_40;
  undefined8 local_38;
  tensor *local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  eVar6 = (error_type)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  local_20 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  input_rgb_image::
  to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
            (in_stack_00000050,in_stack_00000060,in_stack_00000058,in_stack_00000048);
  lVar1 = tensor::num_samples(local_20);
  local_38 = local_8;
  local_40 = local_10;
  dVar2 = std::
          distance<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  if (lVar1 < dVar2) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = std::operator<<((ostream *)local_1b8,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50b);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_1b8,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_1b8,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::add_layer<dlib::con_<64, 7, 7, 2, 2>, dlib::input_rgb_image>::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [LAYER_DETAILS = dlib::con_<64, 7, 7, 2, 2>, INPUT_LAYER = dlib::input_rgb_image, enabled = void, forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_1b8,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"data.num_samples() >= std::distance(ibegin,iend)");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_1b8,std::boolalpha);
    poVar3 = std::operator<<(poVar3,
                             "The input layer can\'t produce fewer output tensors than there are inputs."
                            );
    std::operator<<(poVar3,"\n");
    local_1e9 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              (in_stack_fffffffffffffb90,eVar6,(string *)in_stack_fffffffffffffb80._M_current);
    local_1e9 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar1 = tensor::num_samples(local_20);
  local_1f8 = local_8;
  local_200 = local_10;
  dVar2 = std::
          distance<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  if (lVar1 % dVar2 != 0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_378);
    poVar3 = std::operator<<((ostream *)local_378,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50d);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_378,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_378,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::add_layer<dlib::con_<64, 7, 7, 2, 2>, dlib::input_rgb_image>::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [LAYER_DETAILS = dlib::con_<64, 7, 7, 2, 2>, INPUT_LAYER = dlib::input_rgb_image, enabled = void, forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_378,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"data.num_samples()%std::distance(ibegin,iend) == 0");
    std::operator<<(poVar3,".\n");
    poVar5 = (ostream *)std::ostream::operator<<(local_378,std::boolalpha);
    a = (string *)
        std::operator<<(poVar5,
                        "The number of tensors produced by the input layer must be an integer multiple of the number of input objects."
                       );
    eVar6 = (error_type)((ulong)poVar5 >> 0x20);
    std::operator<<((ostream *)a,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar3,eVar6,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar1 = tensor::num_samples(local_20);
  dVar2 = std::
          distance<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  *(int *)(in_RDI + 0x194) = (int)(lVar1 / dVar2);
  tensor::async_copy_to_device((tensor *)0x141f87);
  return;
}

Assistant:

void to_tensor (
            forward_iterator ibegin,
            forward_iterator iend,
            resizable_tensor& data
        ) const
        {
            input_layer_.to_tensor(ibegin, iend, data);
            // make sure the input layer's to_tensor() function is implemented properly.
            DLIB_CASSERT(data.num_samples() >= std::distance(ibegin,iend), 
            "The input layer can't produce fewer output tensors than there are inputs.");
            DLIB_CASSERT(data.num_samples()%std::distance(ibegin,iend) == 0,
            "The number of tensors produced by the input layer must be an integer multiple of the number of input objects.");

            _sample_expansion_factor = data.num_samples()/std::distance(ibegin,iend);
            data.async_copy_to_device();
        }